

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O0

LDSketch_t * LDSketch_init(int w,int h,int l,int lgn,longlong thresh_abs,uint tbl_id)

{
  ulong uVar1;
  size_t size;
  dyn_tbl_t **ppdVar2;
  dyn_tbl_t *pdVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  uint in_R9D;
  int i;
  LDSketch_t *LDSketch;
  char *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  allocator *nmemb;
  int local_88;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  LDSketch_t *local_28;
  uint local_1c;
  long local_18;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  uVar1 = (long)in_ECX % 8;
  if ((in_ECX / 8 < 0xe) && (uVar1 = (long)in_ECX % 8, (int)uVar1 == 0)) {
    local_1c = in_R9D;
    local_18 = in_R8;
    local_10 = in_ECX;
    local_c = in_EDX;
    local_8 = in_ESI;
    local_4 = in_EDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"LDSketch",&local_49);
    std::__cxx11::string::c_str();
    local_28 = (LDSketch_t *)
               safe_calloc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    size = (size_t)(local_8 * local_4);
    nmemb = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"tbl->tbl",nmemb);
    std::__cxx11::string::c_str();
    ppdVar2 = (dyn_tbl_t **)safe_calloc((size_t)nmemb,size,in_stack_ffffffffffffff50);
    local_28->tbl = ppdVar2;
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    for (local_88 = 0; local_88 < local_8 * local_4; local_88 = local_88 + 1) {
      pdVar3 = dyn_tbl_init((uint)((ulong)nmemb >> 0x20),(int)nmemb,size);
      local_28->tbl[local_88] = pdVar3;
    }
    local_28->h = local_8;
    local_28->w = local_4;
    local_28->l = local_c;
    local_28->lgn = local_10;
    local_28->tbl_id = local_1c;
    local_28->thresh_abs = (double)local_18;
    return local_28;
  }
  fprintf(_stderr,"ERR: n too large or n not multiple of 8\n",uVar1 & 0xffffffff);
  exit(-1);
}

Assistant:

LDSketch_t* LDSketch_init(int w, int h, int l, int lgn, long long thresh_abs,
	unsigned int tbl_id) {
	LDSketch_t* LDSketch;

	// error checking
	if (lgn / 8 > 13 || lgn % 8 != 0) {  // maximum # of bits of a key = 104
		fprintf(stderr, "ERR: n too large or n not multiple of 8\n");
		exit(-1);
	}

	// safe calloc
	LDSketch = (LDSketch_t*)safe_calloc(1, sizeof(LDSketch_t),
		std::string("LDSketch").c_str());
	LDSketch->tbl = (dyn_tbl_t**)safe_calloc(h * w, sizeof(long long),
		std::string("tbl->tbl").c_str());
	for (int i = 0; i < h * w; ++i) {
		LDSketch->tbl[i] = dyn_tbl_init(l, lgn, thresh_abs);
	}

	// set parameters
	LDSketch->h = h;
	LDSketch->w = w;
	LDSketch->l = l;
	// LDSketch->size = h * w;
	LDSketch->lgn = lgn;
	LDSketch->tbl_id = tbl_id;
	LDSketch->thresh_abs = thresh_abs;
	// LDSketch->total = 0;

	// return
	return LDSketch;
}